

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dyndep.h
# Opt level: O0

void __thiscall Dyndeps::Dyndeps(Dyndeps *this,Dyndeps *param_1)

{
  bool bVar1;
  Dyndeps *param_1_local;
  Dyndeps *this_local;
  
  bVar1 = param_1->restat_;
  this->used_ = param_1->used_;
  this->restat_ = bVar1;
  std::vector<Node_*,_std::allocator<Node_*>_>::vector
            (&this->implicit_inputs_,&param_1->implicit_inputs_);
  std::vector<Node_*,_std::allocator<Node_*>_>::vector
            (&this->implicit_outputs_,&param_1->implicit_outputs_);
  return;
}

Assistant:

Dyndeps() : used_(false), restat_(false) {}